

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_chat.cpp
# Opt level: O2

bool CT_Responder(event_t *ev)

{
  ushort uVar1;
  byte bVar2;
  short sVar3;
  char *in_RAX;
  long lVar4;
  BYTE *str;
  FString local_18;
  
  if (chatmodeon == 0) {
    return false;
  }
  if (ev->type != '\x04') {
    return false;
  }
  bVar2 = ev->subtype;
  local_18.Chars = in_RAX;
  if (bVar2 - 1 < 2) {
    sVar3 = ev->data1;
    if (sVar3 == 8) {
      lVar4 = (long)len;
      if (lVar4 == 0) {
        return true;
      }
      len = len + -1;
      (&DAT_009a8aff)[lVar4] = 0;
      return true;
    }
    if (sVar3 == 0x56) {
      if ((ev->data3 & 2) != 0) {
        I_GetFromClipboard(SUB81(&local_18,0));
        CT_PasteChat(local_18.Chars);
        FString::~FString(&local_18);
        return false;
      }
      return false;
    }
    if (sVar3 == 0x1b) {
      chatmodeon = 0;
      return true;
    }
    if (sVar3 == 0x43) {
      if ((ev->data3 & 2) != 0) {
        I_PutInClipboard((char *)ChatQueue);
        return true;
      }
      return false;
    }
    if (sVar3 != 0xd) {
      return false;
    }
    str = ChatQueue;
  }
  else {
    if (bVar2 != 4) {
      if (bVar2 == 10) {
        I_GetFromClipboard(SUB81(&local_18,0));
        CT_PasteChat(local_18.Chars);
        FString::~FString(&local_18);
        return false;
      }
      return false;
    }
    if ((ev->data2 == 0) || (uVar1 = ev->data1 - 0x30, 9 < uVar1)) {
      CT_AddChar((char)ev->data1);
      return true;
    }
    str = (BYTE *)chat_macros[uVar1]->Value;
  }
  ShoveChatStr((char *)str,(char)chatmodeon + 0xff);
  chatmodeon = 0;
  return true;
}

Assistant:

bool CT_Responder (event_t *ev)
{
	if (chatmodeon && ev->type == EV_GUI_Event)
	{
		if (ev->subtype == EV_GUI_KeyDown || ev->subtype == EV_GUI_KeyRepeat)
		{
			if (ev->data1 == '\r')
			{
				ShoveChatStr ((char *)ChatQueue, chatmodeon - 1);
				CT_Stop ();
				return true;
			}
			else if (ev->data1 == GK_ESCAPE)
			{
				CT_Stop ();
				return true;
			}
			else if (ev->data1 == '\b')
			{
				CT_BackSpace ();
				return true;
			}
#ifdef __APPLE__
			else if (ev->data1 == 'C' && (ev->data3 & GKM_META))
#else // !__APPLE__
			else if (ev->data1 == 'C' && (ev->data3 & GKM_CTRL))
#endif // __APPLE__
			{
				I_PutInClipboard ((char *)ChatQueue);
				return true;
			}
#ifdef __APPLE__
			else if (ev->data1 == 'V' && (ev->data3 & GKM_META))
#else // !__APPLE__
			else if (ev->data1 == 'V' && (ev->data3 & GKM_CTRL))
#endif // __APPLE__
			{
				CT_PasteChat(I_GetFromClipboard(false));
			}
		}
		else if (ev->subtype == EV_GUI_Char)
		{
			// send a macro
			if (ev->data2 && (ev->data1 >= '0' && ev->data1 <= '9'))
			{
				ShoveChatStr (*chat_macros[ev->data1 - '0'], chatmodeon - 1);
				CT_Stop ();
			}
			else
			{
				CT_AddChar (char(ev->data1));
			}
			return true;
		}
#ifdef __unix__
		else if (ev->subtype == EV_GUI_MButtonDown)
		{
			CT_PasteChat(I_GetFromClipboard(true));
		}
#endif
	}

	return false;
}